

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_shader_objects(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_shader_objects != 0) {
    glad_glDeleteObjectARB = (PFNGLDELETEOBJECTARBPROC)(*load)("glDeleteObjectARB");
    glad_glGetHandleARB = (PFNGLGETHANDLEARBPROC)(*load)("glGetHandleARB");
    glad_glDetachObjectARB = (PFNGLDETACHOBJECTARBPROC)(*load)("glDetachObjectARB");
    glad_glCreateShaderObjectARB =
         (PFNGLCREATESHADEROBJECTARBPROC)(*load)("glCreateShaderObjectARB");
    glad_glShaderSourceARB = (PFNGLSHADERSOURCEARBPROC)(*load)("glShaderSourceARB");
    glad_glCompileShaderARB = (PFNGLCOMPILESHADERARBPROC)(*load)("glCompileShaderARB");
    glad_glCreateProgramObjectARB =
         (PFNGLCREATEPROGRAMOBJECTARBPROC)(*load)("glCreateProgramObjectARB");
    glad_glAttachObjectARB = (PFNGLATTACHOBJECTARBPROC)(*load)("glAttachObjectARB");
    glad_glLinkProgramARB = (PFNGLLINKPROGRAMARBPROC)(*load)("glLinkProgramARB");
    glad_glUseProgramObjectARB = (PFNGLUSEPROGRAMOBJECTARBPROC)(*load)("glUseProgramObjectARB");
    glad_glValidateProgramARB = (PFNGLVALIDATEPROGRAMARBPROC)(*load)("glValidateProgramARB");
    glad_glUniform1fARB = (PFNGLUNIFORM1FARBPROC)(*load)("glUniform1fARB");
    glad_glUniform2fARB = (PFNGLUNIFORM2FARBPROC)(*load)("glUniform2fARB");
    glad_glUniform3fARB = (PFNGLUNIFORM3FARBPROC)(*load)("glUniform3fARB");
    glad_glUniform4fARB = (PFNGLUNIFORM4FARBPROC)(*load)("glUniform4fARB");
    glad_glUniform1iARB = (PFNGLUNIFORM1IARBPROC)(*load)("glUniform1iARB");
    glad_glUniform2iARB = (PFNGLUNIFORM2IARBPROC)(*load)("glUniform2iARB");
    glad_glUniform3iARB = (PFNGLUNIFORM3IARBPROC)(*load)("glUniform3iARB");
    glad_glUniform4iARB = (PFNGLUNIFORM4IARBPROC)(*load)("glUniform4iARB");
    glad_glUniform1fvARB = (PFNGLUNIFORM1FVARBPROC)(*load)("glUniform1fvARB");
    glad_glUniform2fvARB = (PFNGLUNIFORM2FVARBPROC)(*load)("glUniform2fvARB");
    glad_glUniform3fvARB = (PFNGLUNIFORM3FVARBPROC)(*load)("glUniform3fvARB");
    glad_glUniform4fvARB = (PFNGLUNIFORM4FVARBPROC)(*load)("glUniform4fvARB");
    glad_glUniform1ivARB = (PFNGLUNIFORM1IVARBPROC)(*load)("glUniform1ivARB");
    glad_glUniform2ivARB = (PFNGLUNIFORM2IVARBPROC)(*load)("glUniform2ivARB");
    glad_glUniform3ivARB = (PFNGLUNIFORM3IVARBPROC)(*load)("glUniform3ivARB");
    glad_glUniform4ivARB = (PFNGLUNIFORM4IVARBPROC)(*load)("glUniform4ivARB");
    glad_glUniformMatrix2fvARB = (PFNGLUNIFORMMATRIX2FVARBPROC)(*load)("glUniformMatrix2fvARB");
    glad_glUniformMatrix3fvARB = (PFNGLUNIFORMMATRIX3FVARBPROC)(*load)("glUniformMatrix3fvARB");
    glad_glUniformMatrix4fvARB = (PFNGLUNIFORMMATRIX4FVARBPROC)(*load)("glUniformMatrix4fvARB");
    glad_glGetObjectParameterfvARB =
         (PFNGLGETOBJECTPARAMETERFVARBPROC)(*load)("glGetObjectParameterfvARB");
    glad_glGetObjectParameterivARB =
         (PFNGLGETOBJECTPARAMETERIVARBPROC)(*load)("glGetObjectParameterivARB");
    glad_glGetInfoLogARB = (PFNGLGETINFOLOGARBPROC)(*load)("glGetInfoLogARB");
    glad_glGetAttachedObjectsARB =
         (PFNGLGETATTACHEDOBJECTSARBPROC)(*load)("glGetAttachedObjectsARB");
    glad_glGetUniformLocationARB =
         (PFNGLGETUNIFORMLOCATIONARBPROC)(*load)("glGetUniformLocationARB");
    glad_glGetActiveUniformARB = (PFNGLGETACTIVEUNIFORMARBPROC)(*load)("glGetActiveUniformARB");
    glad_glGetUniformfvARB = (PFNGLGETUNIFORMFVARBPROC)(*load)("glGetUniformfvARB");
    glad_glGetUniformivARB = (PFNGLGETUNIFORMIVARBPROC)(*load)("glGetUniformivARB");
    glad_glGetShaderSourceARB = (PFNGLGETSHADERSOURCEARBPROC)(*load)("glGetShaderSourceARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_shader_objects(GLADloadproc load) {
	if(!GLAD_GL_ARB_shader_objects) return;
	glad_glDeleteObjectARB = (PFNGLDELETEOBJECTARBPROC)load("glDeleteObjectARB");
	glad_glGetHandleARB = (PFNGLGETHANDLEARBPROC)load("glGetHandleARB");
	glad_glDetachObjectARB = (PFNGLDETACHOBJECTARBPROC)load("glDetachObjectARB");
	glad_glCreateShaderObjectARB = (PFNGLCREATESHADEROBJECTARBPROC)load("glCreateShaderObjectARB");
	glad_glShaderSourceARB = (PFNGLSHADERSOURCEARBPROC)load("glShaderSourceARB");
	glad_glCompileShaderARB = (PFNGLCOMPILESHADERARBPROC)load("glCompileShaderARB");
	glad_glCreateProgramObjectARB = (PFNGLCREATEPROGRAMOBJECTARBPROC)load("glCreateProgramObjectARB");
	glad_glAttachObjectARB = (PFNGLATTACHOBJECTARBPROC)load("glAttachObjectARB");
	glad_glLinkProgramARB = (PFNGLLINKPROGRAMARBPROC)load("glLinkProgramARB");
	glad_glUseProgramObjectARB = (PFNGLUSEPROGRAMOBJECTARBPROC)load("glUseProgramObjectARB");
	glad_glValidateProgramARB = (PFNGLVALIDATEPROGRAMARBPROC)load("glValidateProgramARB");
	glad_glUniform1fARB = (PFNGLUNIFORM1FARBPROC)load("glUniform1fARB");
	glad_glUniform2fARB = (PFNGLUNIFORM2FARBPROC)load("glUniform2fARB");
	glad_glUniform3fARB = (PFNGLUNIFORM3FARBPROC)load("glUniform3fARB");
	glad_glUniform4fARB = (PFNGLUNIFORM4FARBPROC)load("glUniform4fARB");
	glad_glUniform1iARB = (PFNGLUNIFORM1IARBPROC)load("glUniform1iARB");
	glad_glUniform2iARB = (PFNGLUNIFORM2IARBPROC)load("glUniform2iARB");
	glad_glUniform3iARB = (PFNGLUNIFORM3IARBPROC)load("glUniform3iARB");
	glad_glUniform4iARB = (PFNGLUNIFORM4IARBPROC)load("glUniform4iARB");
	glad_glUniform1fvARB = (PFNGLUNIFORM1FVARBPROC)load("glUniform1fvARB");
	glad_glUniform2fvARB = (PFNGLUNIFORM2FVARBPROC)load("glUniform2fvARB");
	glad_glUniform3fvARB = (PFNGLUNIFORM3FVARBPROC)load("glUniform3fvARB");
	glad_glUniform4fvARB = (PFNGLUNIFORM4FVARBPROC)load("glUniform4fvARB");
	glad_glUniform1ivARB = (PFNGLUNIFORM1IVARBPROC)load("glUniform1ivARB");
	glad_glUniform2ivARB = (PFNGLUNIFORM2IVARBPROC)load("glUniform2ivARB");
	glad_glUniform3ivARB = (PFNGLUNIFORM3IVARBPROC)load("glUniform3ivARB");
	glad_glUniform4ivARB = (PFNGLUNIFORM4IVARBPROC)load("glUniform4ivARB");
	glad_glUniformMatrix2fvARB = (PFNGLUNIFORMMATRIX2FVARBPROC)load("glUniformMatrix2fvARB");
	glad_glUniformMatrix3fvARB = (PFNGLUNIFORMMATRIX3FVARBPROC)load("glUniformMatrix3fvARB");
	glad_glUniformMatrix4fvARB = (PFNGLUNIFORMMATRIX4FVARBPROC)load("glUniformMatrix4fvARB");
	glad_glGetObjectParameterfvARB = (PFNGLGETOBJECTPARAMETERFVARBPROC)load("glGetObjectParameterfvARB");
	glad_glGetObjectParameterivARB = (PFNGLGETOBJECTPARAMETERIVARBPROC)load("glGetObjectParameterivARB");
	glad_glGetInfoLogARB = (PFNGLGETINFOLOGARBPROC)load("glGetInfoLogARB");
	glad_glGetAttachedObjectsARB = (PFNGLGETATTACHEDOBJECTSARBPROC)load("glGetAttachedObjectsARB");
	glad_glGetUniformLocationARB = (PFNGLGETUNIFORMLOCATIONARBPROC)load("glGetUniformLocationARB");
	glad_glGetActiveUniformARB = (PFNGLGETACTIVEUNIFORMARBPROC)load("glGetActiveUniformARB");
	glad_glGetUniformfvARB = (PFNGLGETUNIFORMFVARBPROC)load("glGetUniformfvARB");
	glad_glGetUniformivARB = (PFNGLGETUNIFORMIVARBPROC)load("glGetUniformivARB");
	glad_glGetShaderSourceARB = (PFNGLGETSHADERSOURCEARBPROC)load("glGetShaderSourceARB");
}